

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O0

void __thiscall OpenMD::GB::addType(GB *this,AtomType *atomType)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  reference piVar6;
  reference pvVar7;
  reference pvVar8;
  AtomType *in_RSI;
  long in_RDI;
  RealType RVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  AtomType *this_00;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  RealType mi;
  string DistanceMix;
  ForceFieldOptions *fopts;
  GBInteractionData mixer2;
  GBInteractionData mixer1;
  RealType dw2;
  RealType eE2;
  RealType eS2;
  RealType eX2;
  RealType l2;
  RealType d2;
  GayBerneAdapter gba2;
  LennardJonesAdapter lja2;
  AtomType *atype2;
  int gbtid2;
  iterator it;
  GayBerneAdapter gba1;
  LennardJonesAdapter lja1;
  RealType dw1;
  RealType eE1;
  RealType eS1;
  RealType eX1;
  RealType l1;
  RealType d1;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int gbtid;
  int atid;
  undefined5 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  LennardJonesAdapter *in_stack_fffffffffffffd40;
  locale *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd78;
  int ident;
  ForceField *in_stack_fffffffffffffd80;
  locale local_200 [8];
  string local_1f8 [32];
  ForceFieldOptions *local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  undefined1 local_188;
  byte local_187;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  byte local_138;
  undefined1 local_137;
  string local_130 [32];
  RealType local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  RealType local_e8;
  GayBerneAdapter local_e0;
  LennardJonesAdapter local_d8;
  AtomType *local_d0;
  value_type local_c4;
  _Self local_c0;
  _Base_ptr local_b8;
  _Rb_tree_const_iterator<int> local_b0;
  string local_a8 [32];
  GayBerneAdapter local_88;
  LennardJonesAdapter local_80;
  RealType local_78;
  RealType local_70;
  RealType local_68;
  RealType local_60;
  RealType local_58;
  RealType local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_38;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_28;
  value_type local_18;
  uint local_14;
  AtomType *local_10;
  
  local_10 = in_RSI;
  local_14 = AtomType::getIdent(in_RSI);
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3827f4);
  local_18 = (value_type)sVar3;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffffd30);
  pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                      (value_type_conflict1 *)in_stack_fffffffffffffd48);
  local_48 = (_Base_ptr)pVar13.first._M_node;
  local_40 = pVar13.second;
  local_38.first._M_node = local_48;
  local_38.second = (bool)local_40;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_28,&local_38);
  if ((local_28.second & 1U) == 0) {
    snprintf(painCave.errMsg,2000,"GB already had a previous entry with ident %d\n",(ulong)local_14)
    ;
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  vVar1 = local_18;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)(int)local_14);
  *pvVar4 = vVar1;
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                *)(in_RDI + 0x78),(long)local_18);
  std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
            ((vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_> *)
             in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_78 = 0.0;
  LennardJonesAdapter::LennardJonesAdapter(&local_80,local_10);
  GayBerneAdapter::GayBerneAdapter(&local_88,local_10);
  bVar2 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x382997);
  if (bVar2) {
    local_50 = GayBerneAdapter::getD((GayBerneAdapter *)in_stack_fffffffffffffd50);
    local_58 = GayBerneAdapter::getL((GayBerneAdapter *)in_stack_fffffffffffffd50);
    local_60 = GayBerneAdapter::getEpsX((GayBerneAdapter *)in_stack_fffffffffffffd50);
    local_68 = GayBerneAdapter::getEpsS((GayBerneAdapter *)in_stack_fffffffffffffd50);
    local_70 = GayBerneAdapter::getEpsE((GayBerneAdapter *)in_stack_fffffffffffffd50);
    local_78 = GayBerneAdapter::getDw((GayBerneAdapter *)in_stack_fffffffffffffd50);
  }
  else {
    bVar2 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x382a36);
    if (bVar2) {
      RVar9 = LennardJonesAdapter::getSigma(in_stack_fffffffffffffd40);
      local_58 = sqrt(2.0);
      local_58 = RVar9 / local_58;
      local_50 = local_58;
      local_70 = LennardJonesAdapter::getEpsilon(in_stack_fffffffffffffd40);
      local_78 = 1.0;
      local_68 = local_70;
      local_60 = local_70;
    }
    else {
      AtomType::getName_abi_cxx11_
                ((AtomType *)
                 CONCAT17(in_stack_fffffffffffffd2f,
                          CONCAT16(in_stack_fffffffffffffd2e,
                                   CONCAT15(in_stack_fffffffffffffd2d,in_stack_fffffffffffffd28))));
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "GB::addType was passed an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
               ,uVar5);
      std::__cxx11::string::~string(local_a8);
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
  }
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_b0);
  local_b8 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffffd2f,
                                 CONCAT16(in_stack_fffffffffffffd2e,
                                          CONCAT15(in_stack_fffffffffffffd2d,
                                                   in_stack_fffffffffffffd28))));
  local_b0._M_node = local_b8;
  while( true ) {
    ident = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    local_c0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffd2f,
                             CONCAT16(in_stack_fffffffffffffd2e,
                                      CONCAT15(in_stack_fffffffffffffd2d,in_stack_fffffffffffffd28))
                            ));
    bVar2 = std::operator!=(&local_b0,&local_c0);
    if (!bVar2) break;
    piVar6 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffd30);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*piVar6);
    local_c4 = *pvVar4;
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffd30);
    local_d0 = ForceField::getAtomType(in_stack_fffffffffffffd80,ident);
    LennardJonesAdapter::LennardJonesAdapter(&local_d8,local_d0);
    GayBerneAdapter::GayBerneAdapter(&local_e0,local_d0);
    local_e8 = 0.0;
    local_f0 = 0.0;
    local_f8 = 0.0;
    local_100 = 0.0;
    local_108 = 0.0;
    local_110 = 0.0;
    bVar2 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x382cb3);
    if (bVar2) {
      local_e8 = GayBerneAdapter::getD((GayBerneAdapter *)in_stack_fffffffffffffd50);
      local_f0 = GayBerneAdapter::getL((GayBerneAdapter *)in_stack_fffffffffffffd50);
      local_f8 = GayBerneAdapter::getEpsX((GayBerneAdapter *)in_stack_fffffffffffffd50);
      local_100 = GayBerneAdapter::getEpsS((GayBerneAdapter *)in_stack_fffffffffffffd50);
      local_108 = GayBerneAdapter::getEpsE((GayBerneAdapter *)in_stack_fffffffffffffd50);
      local_110 = GayBerneAdapter::getDw((GayBerneAdapter *)in_stack_fffffffffffffd50);
    }
    else {
      bVar2 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x382d52);
      if (bVar2) {
        RVar9 = LennardJonesAdapter::getSigma(in_stack_fffffffffffffd40);
        local_f0 = sqrt(2.0);
        local_f0 = RVar9 / local_f0;
        local_e8 = local_f0;
        local_108 = LennardJonesAdapter::getEpsilon(in_stack_fffffffffffffd40);
        local_110 = 1.0;
        local_100 = local_108;
        local_f8 = local_108;
      }
      else {
        AtomType::getName_abi_cxx11_
                  ((AtomType *)
                   CONCAT17(in_stack_fffffffffffffd2f,
                            CONCAT16(in_stack_fffffffffffffd2e,
                                     CONCAT15(in_stack_fffffffffffffd2d,in_stack_fffffffffffffd28)))
                  );
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "GB::addType found an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
                 ,uVar5);
        std::__cxx11::string::~string(local_130);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
    }
    local_1d8 = ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 0x98));
    ForceFieldOptions::getDistanceMixingRule_abi_cxx11_
              ((ForceFieldOptions *)
               CONCAT17(in_stack_fffffffffffffd2f,
                        CONCAT16(in_stack_fffffffffffffd2e,
                                 CONCAT15(in_stack_fffffffffffffd2d,in_stack_fffffffffffffd28))));
    std::locale::locale(local_200);
    toUpper<std::__cxx11::string>(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::locale::~locale(local_200);
    bVar2 = std::operator==(in_stack_fffffffffffffd30,
                            (char *)CONCAT17(in_stack_fffffffffffffd2f,
                                             CONCAT16(in_stack_fffffffffffffd2e,
                                                      CONCAT15(in_stack_fffffffffffffd2d,
                                                               in_stack_fffffffffffffd28))));
    if (bVar2) {
      local_180 = (local_50 + local_e8) * 0.5;
    }
    else {
      local_180 = sqrt(local_50 * local_50 + local_e8 * local_e8);
    }
    local_1a8 = (local_58 * local_58 - local_50 * local_50) /
                (local_58 * local_58 + local_e8 * local_e8);
    local_1b0 = (local_f0 * local_f0 - local_e8 * local_e8) /
                (local_f0 * local_f0 + local_50 * local_50);
    local_1b8 = ((local_58 * local_58 - local_50 * local_50) *
                (local_f0 * local_f0 - local_e8 * local_e8)) /
                ((local_f0 * local_f0 + local_50 * local_50) *
                (local_58 * local_58 + local_e8 * local_e8));
    local_1d0 = local_180;
    local_170 = (local_78 + local_110) * 0.5;
    local_168 = local_1b8;
    local_160 = local_1a8;
    local_158 = local_1b0;
    local_1c8 = sqrt(local_60 * local_f8);
    local_1c0 = local_170;
    dVar10 = 1.0 / *(double *)(in_RDI + 0xd0);
    local_178 = local_1c8;
    in_stack_fffffffffffffd30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pow(local_68,dVar10);
    dVar11 = pow(local_70,dVar10);
    in_stack_fffffffffffffd40 = (LennardJonesAdapter *)((double)in_stack_fffffffffffffd30 - dVar11);
    dVar11 = pow(local_68,dVar10);
    dVar12 = pow(local_108,dVar10);
    local_148 = (double)in_stack_fffffffffffffd40 / (dVar11 + dVar12);
    in_stack_fffffffffffffd48 = (locale *)pow(local_100,dVar10);
    dVar11 = pow(local_108,dVar10);
    dVar11 = (double)in_stack_fffffffffffffd48 - dVar11;
    in_stack_fffffffffffffd50 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pow(local_100,dVar10);
    dVar12 = pow(local_70,dVar10);
    local_140 = dVar11 / ((double)in_stack_fffffffffffffd50 + dVar12);
    dVar11 = pow(local_68,dVar10);
    dVar12 = pow(local_70,dVar10);
    this_00 = (AtomType *)(dVar11 - dVar12);
    dVar11 = pow(local_100,dVar10);
    dVar12 = pow(local_108,dVar10);
    in_stack_fffffffffffffd80 = (ForceField *)((double)this_00 * (dVar11 - dVar12));
    in_stack_fffffffffffffd78 = pow(local_100,dVar10);
    dVar11 = pow(local_70,dVar10);
    dVar11 = (double)in_stack_fffffffffffffd80 / (in_stack_fffffffffffffd78 + dVar11);
    dVar12 = pow(local_68,dVar10);
    dVar10 = pow(local_108,dVar10);
    local_1a0 = dVar11 / (dVar12 + dVar10);
    local_198 = local_140;
    local_190 = local_148;
    local_150 = local_1a0;
    local_138 = AtomType::isLennardJones(this_00);
    in_stack_fffffffffffffd2f = AtomType::isLennardJones(this_00);
    local_187 = local_138 & 1;
    local_188 = in_stack_fffffffffffffd2f;
    local_137 = in_stack_fffffffffffffd2f;
    in_stack_fffffffffffffd2e = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x383470);
    if (((bool)in_stack_fffffffffffffd2e) ||
       (in_stack_fffffffffffffd2d = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x38348d),
       (bool)in_stack_fffffffffffffd2d)) {
      std::
      vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                    *)(in_RDI + 0x78),(long)local_c4);
      std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
                ((vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_> *)
                 in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      pvVar7 = std::
               vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
               ::operator[]((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                             *)(in_RDI + 0x78),(long)local_18);
      pvVar8 = std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::
               operator[](pvVar7,(long)local_c4);
      memcpy(pvVar8,&local_180,0x50);
      if (local_c4 != local_18) {
        pvVar7 = std::
                 vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                               *)(in_RDI + 0x78),(long)local_c4);
        pvVar8 = std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                 ::operator[](pvVar7,(long)local_18);
        memcpy(pvVar8,&local_1d0,0x50);
      }
    }
    std::__cxx11::string::~string(local_1f8);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffd30);
  }
  return;
}

Assistant:

void GB::addType(AtomType* atomType) {
    // add it to the map:
    int atid  = atomType->getIdent();
    int gbtid = GBtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = GBtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    GBtids[atid] = gbtid;
    MixingMap[gbtid].resize(nGB_);

    RealType d1(0.0), l1(0.0), eX1(0.0), eS1(0.0), eE1(0.0), dw1(0.0);

    LennardJonesAdapter lja1 = LennardJonesAdapter(atomType);
    GayBerneAdapter gba1     = GayBerneAdapter(atomType);
    if (gba1.isGayBerne()) {
      d1  = gba1.getD();
      l1  = gba1.getL();
      eX1 = gba1.getEpsX();
      eS1 = gba1.getEpsS();
      eE1 = gba1.getEpsE();
      dw1 = gba1.getDw();
    } else if (lja1.isLennardJones()) {
      d1  = lja1.getSigma() / sqrt(2.0);
      l1  = d1;
      eX1 = lja1.getEpsilon();
      eS1 = eX1;
      eE1 = eX1;
      dw1 = 1.0;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB::addType was passed an atomType (%s) that does not\n"
               "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = GBtypes.begin(); it != GBtypes.end(); ++it) {
      int gbtid2       = GBtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      LennardJonesAdapter lja2 = LennardJonesAdapter(atype2);
      GayBerneAdapter gba2     = GayBerneAdapter(atype2);
      RealType d2(0.0), l2(0.0), eX2(0.0), eS2(0.0), eE2(0.0), dw2(0.0);

      if (gba2.isGayBerne()) {
        d2  = gba2.getD();
        l2  = gba2.getL();
        eX2 = gba2.getEpsX();
        eS2 = gba2.getEpsS();
        eE2 = gba2.getEpsE();
        dw2 = gba2.getDw();
      } else if (lja2.isLennardJones()) {
        d2  = lja2.getSigma() / sqrt(2.0);
        l2  = d2;
        eX2 = lja2.getEpsilon();
        eS2 = eX2;
        eE2 = eX2;
        dw2 = 1.0;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GB::addType found an atomType (%s) that does not\n"
                 "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
                 atype2->getName().c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      GBInteractionData mixer1, mixer2;

      //  Cleaver paper uses sqrt of squares to get sigma0 for
      //  mixed interactions.
      ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
      string DistanceMix       = fopts.getDistanceMixingRule();
      toUpper(DistanceMix);

      if (DistanceMix == "ARITHMETIC")
        mixer1.sigma0 = 0.5 * (d1 + d2);
      else
        mixer1.sigma0 = sqrt(d1 * d1 + d2 * d2);

      mixer1.xa2  = (l1 * l1 - d1 * d1) / (l1 * l1 + d2 * d2);
      mixer1.xai2 = (l2 * l2 - d2 * d2) / (l2 * l2 + d1 * d1);
      mixer1.x2   = (l1 * l1 - d1 * d1) * (l2 * l2 - d2 * d2) /
                  ((l2 * l2 + d1 * d1) * (l1 * l1 + d2 * d2));

      mixer2.sigma0 = mixer1.sigma0;
      // xa2 and xai2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xa2  = mixer1.xai2;
      mixer2.xai2 = mixer1.xa2;
      mixer2.x2   = mixer1.x2;

      // assumed LB mixing rules for now:

      mixer1.dw   = 0.5 * (dw1 + dw2);
      mixer1.eps0 = sqrt(eX1 * eX2);

      mixer2.dw   = mixer1.dw;
      mixer2.eps0 = mixer1.eps0;

      RealType mi = RealType(1.0) / mu_;

      mixer1.xpap2 =
          (pow(eS1, mi) - pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));
      mixer1.xpapi2 =
          (pow(eS2, mi) - pow(eE2, mi)) / (pow(eS2, mi) + pow(eE1, mi));
      mixer1.xp2 =
          (pow(eS1, mi) - pow(eE1, mi)) * (pow(eS2, mi) - pow(eE2, mi)) /
          (pow(eS2, mi) + pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));

      // xpap2 and xpapi2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xpap2  = mixer1.xpapi2;
      mixer2.xpapi2 = mixer1.xpap2;
      mixer2.xp2    = mixer1.xp2;
      // keep track of who is the LJ atom:
      mixer1.i_is_LJ = atomType->isLennardJones();
      mixer1.j_is_LJ = atype2->isLennardJones();
      mixer2.i_is_LJ = mixer1.j_is_LJ;
      mixer2.j_is_LJ = mixer1.i_is_LJ;

      // only add this pairing if at least one of the atoms is a Gay-Berne atom

      if (gba1.isGayBerne() || gba2.isGayBerne()) {
        MixingMap[gbtid2].resize(nGB_);
        MixingMap[gbtid][gbtid2] = mixer1;
        if (gbtid2 != gbtid) { MixingMap[gbtid2][gbtid] = mixer2; }
      }
    }
  }